

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::set_allocated_gazetteer(Model *this,Gazetteer *gazetteer)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Gazetteer *gazetteer_local;
  Model *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (gazetteer != (Gazetteer *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&gazetteer->super_MessageLite);
    message_arena = (Arena *)gazetteer;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::CoreMLModels::Gazetteer>
                              (message_arena_00,gazetteer,submessage_arena_00);
    }
    set_has_gazetteer(this);
    (this->Type_).pipelineclassifier_ = (PipelineClassifier *)message_arena;
  }
  return;
}

Assistant:

void Model::set_allocated_gazetteer(::CoreML::Specification::CoreMLModels::Gazetteer* gazetteer) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (gazetteer) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(gazetteer));
    if (message_arena != submessage_arena) {
      gazetteer = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, gazetteer, submessage_arena);
    }
    set_has_gazetteer();
    Type_.gazetteer_ = gazetteer;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.gazetteer)
}